

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O3

String * __thiscall
kj::str<kj::ArrayPtr<kj::ArrayPtr<int>>&>
          (String *__return_storage_ptr__,kj *this,ArrayPtr<kj::ArrayPtr<int>_> *params)

{
  long lVar1;
  undefined8 uVar2;
  undefined8 local_40;
  undefined8 uStack_38;
  char *local_30;
  undefined8 local_28;
  long local_20;
  undefined8 uStack_18;
  undefined8 *local_10;
  
  local_40 = *(undefined8 *)this;
  uStack_38 = *(undefined8 *)(this + 8);
  local_30 = ", ";
  local_28 = 3;
  local_20 = 0;
  uStack_18 = 0;
  local_10 = (undefined8 *)0x0;
  _::concat<kj::_::Delimited<kj::ArrayPtr<kj::ArrayPtr<int>>>>
            (__return_storage_ptr__,(_ *)&local_40,
             (Delimited<kj::ArrayPtr<kj::ArrayPtr<int>_>_> *)params);
  uVar2 = uStack_18;
  lVar1 = local_20;
  if (local_20 != 0) {
    local_20 = 0;
    uStack_18 = 0;
    (**(code **)*local_10)
              (local_10,lVar1,0x38,uVar2,uVar2,
               ArrayDisposer::Dispose_<kj::_::Delimited<kj::ArrayPtr<int>_>_>::destruct);
  }
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}